

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O3

void Am_Insert_JChar_At_Cursor(Am_Object *text,char c,bool advance_cursor)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  Am_Value *pAVar7;
  byte *pbVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  Am_Object *this;
  Am_String old_str;
  Am_String local_118;
  uint local_10c;
  ulong local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  pAVar7 = Am_Object::Get(text,0xad,0);
  uVar5 = Am_Value::operator_cast_to_int(pAVar7);
  Am_Object::Am_Object(&local_98,text);
  iVar6 = ml_head_pos(&local_98);
  Am_Object::~Am_Object(&local_98);
  if ((int)uVar5 < iVar6) {
    return;
  }
  pAVar7 = Am_Object::Get(text,0xe4,0);
  bVar3 = Am_Value::operator_cast_to_bool(pAVar7);
  if (bVar3) {
    Am_Object::Am_Object(&local_a0,text);
    Am_Delete_Entire_String(&local_a0);
    Am_Object::~Am_Object(&local_a0);
  }
  pAVar7 = Am_Object::Get(text,0xab,0);
  Am_String::Am_String(&local_118,pAVar7);
  pbVar8 = (byte *)Am_String::operator_cast_to_char_(&local_118);
  bVar1 = *pbVar8;
  uVar10 = iVar6 + 2;
  if (uVar5 < uVar10) {
    uVar5 = (int)c - 0x61U >> 1;
    uVar10 = uVar5 | (uint)(((int)c - 0x61U & 1) != 0) << 0x1f;
    if ((uVar10 < 0xb) && ((0x495U >> (uVar5 & 0x1f) & 1) != 0)) {
      lVar2 = *(long *)(&DAT_00287cb8 + (ulong)uVar10 * 8);
      this = &local_90;
      Am_Object::Am_Object(this,text);
      pbVar8 = (byte *)rktab[0][lVar2];
      bVar4 = *pbVar8;
      if (bVar4 == 0) {
        pcVar9 = to_correct_code::buf;
      }
      else {
        pcVar9 = to_correct_code::buf;
        do {
          pbVar8 = pbVar8 + 1;
          *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
          pcVar9 = (char *)((byte *)pcVar9 + 1);
          bVar4 = *pbVar8;
        } while (bVar4 != 0);
      }
      *pcVar9 = 0;
      Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
    }
    else {
      this = &local_88;
      Am_Object::Am_Object(this,text);
      pbVar8 = (byte *)onetotwo[c];
      bVar4 = *pbVar8;
      if (bVar4 == 0) {
        pcVar9 = to_correct_code::buf;
      }
      else {
        pcVar9 = to_correct_code::buf;
        do {
          pbVar8 = pbVar8 + 1;
          *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
          pcVar9 = (char *)((byte *)pcVar9 + 1);
          bVar4 = *pbVar8;
        } while (bVar4 != 0);
      }
      *pcVar9 = 0;
      Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
    }
  }
  else {
    local_10c = uVar5 - 2;
    uVar12 = (int)c - 0x61;
    if (uVar12 < 0x19) {
      if ((0x104111U >> (uVar12 & 0x1f) & 1) != 0) goto LAB_001dbf09;
      if ((0x1000080U >> (uVar12 & 0x1f) & 1) == 0) {
        if ((uVar12 == 0xd) &&
           (pcVar9 = Am_String::operator_cast_to_char_(&local_118),
           ((byte)pcVar9[(ulong)local_10c + 1] & 0x7f | ((byte)pcVar9[local_10c] & 0x7f) << 8) ==
           (((byte)*onetotwo[0x6e] & 0x7f) << 8 | (byte)onetotwo[0x6e][1] & 0x7f))) {
          Am_Object::Am_Object(&local_a8,text);
          Am_Delete_Char_Before_Cursor(&local_a8);
          Am_Object::~Am_Object(&local_a8);
          this = &local_38;
          Am_Object::Am_Object(this,text);
          bVar4 = *n_Japanese;
          if (bVar4 == 0) {
            pcVar9 = to_correct_code::buf;
          }
          else {
            pcVar9 = to_correct_code::buf;
            pbVar8 = (byte *)n_Japanese;
            do {
              pbVar8 = pbVar8 + 1;
              *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
              pcVar9 = (char *)((byte *)pcVar9 + 1);
              bVar4 = *pbVar8;
            } while (bVar4 != 0);
          }
          *pcVar9 = 0;
          Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
          goto LAB_001dc8b7;
        }
        goto LAB_001dc261;
      }
LAB_001dbf77:
      bVar4 = (byte)(c + 0x9bU) >> 1 | (c + 0x9bU) * -0x80;
      if ((8 < bVar4) || ((0x125U >> (bVar4 & 0x1f) & 1) == 0)) {
        pcVar9 = Am_String::operator_cast_to_char_(&local_118);
        iVar6 = jcomp(pcVar9 + local_10c,onetotwo[(byte)c]);
        if (iVar6 == 0) {
          Am_Object::Am_Object(&local_c0,text);
          Am_Move_Cursor_Left(&local_c0);
          Am_Object::~Am_Object(&local_c0);
          Am_Object::Am_Object(&local_c8,text);
          bVar4 = *small_tsu;
          if (bVar4 == 0) {
            pcVar9 = to_correct_code::buf;
          }
          else {
            pcVar9 = to_correct_code::buf;
            pbVar8 = (byte *)small_tsu;
            do {
              pbVar8 = pbVar8 + 1;
              *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
              pcVar9 = (char *)((byte *)pcVar9 + 1);
              bVar4 = *pbVar8;
            } while (bVar4 != 0);
          }
          *pcVar9 = 0;
          Am_Insert_String_At_Cursor(&local_c8,to_correct_code::buf,true);
          Am_Object::~Am_Object(&local_c8);
          if (!advance_cursor) goto LAB_001dc8bf;
          this = &local_48;
          Am_Object::Am_Object(this,text);
          Am_Move_Cursor_Right(this);
          goto LAB_001dc8b7;
        }
      }
    }
    else {
LAB_001dc261:
      pcVar9 = Am_String::operator_cast_to_char_(&local_118);
      if (((byte)pcVar9[(ulong)local_10c + 1] & 0x7f | ((byte)pcVar9[local_10c] & 0x7f) << 8) ==
          (((byte)*onetotwo[0x6e] & 0x7f) << 8 | (byte)onetotwo[0x6e][1] & 0x7f)) {
        Am_Object::Am_Object(&local_b0,text);
        Am_Delete_Char_Before_Cursor(&local_b0);
        Am_Object::~Am_Object(&local_b0);
        Am_Object::Am_Object(&local_b8,text);
        bVar4 = *n_Japanese;
        if (bVar4 == 0) {
          pcVar9 = to_correct_code::buf;
        }
        else {
          pcVar9 = to_correct_code::buf;
          pbVar8 = (byte *)n_Japanese;
          do {
            pbVar8 = pbVar8 + 1;
            *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
            pcVar9 = (char *)((byte *)pcVar9 + 1);
            bVar4 = *pbVar8;
          } while (bVar4 != 0);
        }
        *pcVar9 = 0;
        pcVar9 = to_correct_code::buf;
        Am_Insert_String_At_Cursor(&local_b8,to_correct_code::buf,true);
        Am_Object::~Am_Object(&local_b8);
        this = &local_40;
        Am_Object::Am_Object(this,text);
        pbVar8 = (byte *)onetotwo[c];
        bVar4 = *pbVar8;
        if (bVar4 != 0) {
          pcVar9 = to_correct_code::buf;
          do {
            pbVar8 = pbVar8 + 1;
            *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
            pcVar9 = (char *)((byte *)pcVar9 + 1);
            bVar4 = *pbVar8;
          } while (bVar4 != 0);
        }
        *pcVar9 = 0;
        Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
        goto LAB_001dc8b7;
      }
LAB_001dbf09:
      if (0xe6 < (byte)(c + 0x85U)) goto LAB_001dbf77;
    }
    uVar13 = uVar12 >> 1 | (uint)((uVar12 & 1) != 0) << 0x1f;
    if ((uVar13 < 0xb) && ((0x495U >> (uVar12 >> 1 & 0x1f) & 1) != 0)) {
      local_108 = (ulong)*(uint *)(&DAT_00287c8c + (ulong)uVar13 * 4);
      pcVar9 = Am_String::operator_cast_to_char_(&local_118);
      uVar11 = (ulong)local_10c;
      if (((byte)pcVar9[uVar11 + 1] & 0x7f | ((byte)pcVar9[uVar11] & 0x7f) << 8) ==
          (((byte)*onetotwo[0x79] & 0x7f) << 8 | (byte)onetotwo[0x79][1] & 0x7f)) {
        if (uVar10 <= local_10c) {
          pcVar9 = Am_String::operator_cast_to_char_(&local_118);
          uVar10 = ((byte)pcVar9[(ulong)uVar5 - 3] & 0x7f |
                   ((byte)pcVar9[(ulong)uVar5 - 4] & 0x7f) << 8) -
                   (((byte)*onetotwo[0x61] & 0x7f) << 8 | (byte)onetotwo[0x61][1] & 0x7f);
          uVar5 = 0xffffffff;
          if (uVar10 < 0x1a) {
            uVar5 = uVar10;
          }
          if (0 < (int)uVar5) {
            Am_Object::Am_Object(&local_d0,text);
            Am_Delete_Char_Before_Cursor(&local_d0);
            Am_Object::~Am_Object(&local_d0);
            Am_Object::Am_Object(&local_d8,text);
            Am_Delete_Char_Before_Cursor(&local_d8);
            Am_Object::~Am_Object(&local_d8);
            this = &local_58;
            Am_Object::Am_Object(this,text);
            pbVar8 = *(byte **)((ulong)uVar5 * 0x50 + 0x2ebd78 + local_108 * 8);
            bVar4 = *pbVar8;
            if (bVar4 == 0) {
              pcVar9 = to_correct_code::buf;
            }
            else {
              pcVar9 = to_correct_code::buf;
              do {
                pbVar8 = pbVar8 + 1;
                *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
                pcVar9 = (char *)((byte *)pcVar9 + 1);
                bVar4 = *pbVar8;
              } while (bVar4 != 0);
            }
            *pcVar9 = 0;
            Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
            goto LAB_001dc8b7;
          }
        }
        Am_Object::Am_Object(&local_e0,text);
        Am_Delete_Char_Before_Cursor(&local_e0);
        Am_Object::~Am_Object(&local_e0);
        this = &local_60;
        Am_Object::Am_Object(this,text);
        pbVar8 = (byte *)rktab[0x18][local_108];
        bVar4 = *pbVar8;
        if (bVar4 == 0) {
          pcVar9 = to_correct_code::buf;
        }
        else {
          pcVar9 = to_correct_code::buf;
          do {
            pbVar8 = pbVar8 + 1;
            *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
            pcVar9 = (char *)((byte *)pcVar9 + 1);
            bVar4 = *pbVar8;
          } while (bVar4 != 0);
        }
        *pcVar9 = 0;
        Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
      }
      else {
        pcVar9 = Am_String::operator_cast_to_char_(&local_118);
        if (((byte)pcVar9[uVar11 + 1] & 0x7f | ((byte)pcVar9[uVar11] & 0x7f) << 8) ==
            (((byte)*onetotwo[0x68] & 0x7f) << 8 | (byte)onetotwo[0x68][1] & 0x7f)) {
          if (uVar10 <= local_10c) {
            pcVar9 = Am_String::operator_cast_to_char_(&local_118);
            uVar5 = isalpha_2(pcVar9 + ((ulong)uVar5 - 4));
            if (0 < (int)uVar5) {
              Am_Object::Am_Object(&local_e8,text);
              Am_Delete_Char_Before_Cursor(&local_e8);
              Am_Object::~Am_Object(&local_e8);
              Am_Object::Am_Object(&local_f0,text);
              Am_Delete_Char_Before_Cursor(&local_f0);
              Am_Object::~Am_Object(&local_f0);
              this = &local_68;
              Am_Object::Am_Object(this,text);
              pbVar8 = *(byte **)((ulong)uVar5 * 0x50 + 0x2ebd78 + local_108 * 8);
              bVar4 = *pbVar8;
              if (bVar4 == 0) {
                pcVar9 = to_correct_code::buf;
              }
              else {
                pcVar9 = to_correct_code::buf;
                do {
                  pbVar8 = pbVar8 + 1;
                  *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
                  pcVar9 = (char *)((byte *)pcVar9 + 1);
                  bVar4 = *pbVar8;
                } while (bVar4 != 0);
              }
              *pcVar9 = 0;
              Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
              goto LAB_001dc8b7;
            }
          }
          Am_Object::Am_Object(&local_f8,text);
          Am_Delete_Char_Before_Cursor(&local_f8);
          Am_Object::~Am_Object(&local_f8);
          this = &local_70;
          Am_Object::Am_Object(this,text);
          pbVar8 = (byte *)rktab[7][local_108];
          bVar4 = *pbVar8;
          if (bVar4 == 0) {
            pcVar9 = to_correct_code::buf;
          }
          else {
            pcVar9 = to_correct_code::buf;
            do {
              pbVar8 = pbVar8 + 1;
              *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
              pcVar9 = (char *)((byte *)pcVar9 + 1);
              bVar4 = *pbVar8;
            } while (bVar4 != 0);
          }
          *pcVar9 = 0;
          Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
        }
        else {
          pcVar9 = Am_String::operator_cast_to_char_(&local_118);
          uVar10 = ((byte)pcVar9[uVar11 + 1] & 0x7f | ((byte)pcVar9[uVar11] & 0x7f) << 8) -
                   (((byte)*onetotwo[0x61] & 0x7f) << 8 | (byte)onetotwo[0x61][1] & 0x7f);
          uVar5 = 0xffffffff;
          if (uVar10 < 0x1a) {
            uVar5 = uVar10;
          }
          if ((int)uVar5 < 1) {
            this = &local_80;
            Am_Object::Am_Object(this,text);
            pbVar8 = (byte *)rktab[0][local_108];
            bVar4 = *pbVar8;
            if (bVar4 == 0) {
              pcVar9 = to_correct_code::buf;
            }
            else {
              pcVar9 = to_correct_code::buf;
              do {
                pbVar8 = pbVar8 + 1;
                *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
                pcVar9 = (char *)((byte *)pcVar9 + 1);
                bVar4 = *pbVar8;
              } while (bVar4 != 0);
            }
            *pcVar9 = 0;
            Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
          }
          else {
            Am_Object::Am_Object(&local_100,text);
            Am_Delete_Char_Before_Cursor(&local_100);
            Am_Object::~Am_Object(&local_100);
            this = &local_78;
            Am_Object::Am_Object(this,text);
            pbVar8 = (byte *)rktab[uVar5][local_108];
            bVar4 = *pbVar8;
            if (bVar4 == 0) {
              pcVar9 = to_correct_code::buf;
            }
            else {
              pcVar9 = to_correct_code::buf;
              do {
                pbVar8 = pbVar8 + 1;
                *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
                pcVar9 = (char *)((byte *)pcVar9 + 1);
                bVar4 = *pbVar8;
              } while (bVar4 != 0);
            }
            *pcVar9 = 0;
            Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
          }
        }
      }
    }
    else {
      this = &local_50;
      Am_Object::Am_Object(this,text);
      pbVar8 = (byte *)onetotwo[c];
      bVar4 = *pbVar8;
      if (bVar4 == 0) {
        pcVar9 = to_correct_code::buf;
      }
      else {
        pcVar9 = to_correct_code::buf;
        do {
          pbVar8 = pbVar8 + 1;
          *pcVar9 = bVar4 & 0x7f | bVar1 & 0x80;
          pcVar9 = (char *)((byte *)pcVar9 + 1);
          bVar4 = *pbVar8;
        } while (bVar4 != 0);
      }
      *pcVar9 = 0;
      Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
    }
  }
LAB_001dc8b7:
  Am_Object::~Am_Object(this);
LAB_001dc8bf:
  Am_String::~Am_String(&local_118);
  return;
}

Assistant:

void
Am_Insert_JChar_At_Cursor(Am_Object text, char c, bool advance_cursor)
{
  int cursor_index = text.Get(Am_CURSOR_INDEX);
  int head_pos = ml_head_pos(text);
  if (cursor_index >= head_pos) {
    if ((bool)text.Get(Am_PENDING_DELETE)) //delete all text first
      Am_Delete_Entire_String(text);
    Am_String old_str = text.Get(Am_TEXT);
    bool eucf = iseuc((const char *)old_str);
    if (cursor_index >= head_pos + 2) {
      cursor_index -= 2;
      if (c == 'n' &&
          jcomp(&((const char *)old_str)[cursor_index], onetotwo['n']) ==
              0) { // case 'nn'
        Am_Delete_Char_Before_Cursor(text);
        Am_Insert_String_At_Cursor(text, to_correct_code(n_Japanese, eucf),
                                   advance_cursor);
      } else if (!isboin(c) && c != 'h' && c != 'y' &&
                 jcomp(&((const char *)old_str)[cursor_index], onetotwo['n']) ==
                     0) { // case 'nt' etc.
        Am_Delete_Char_Before_Cursor(text);
        Am_Insert_String_At_Cursor(text, to_correct_code(n_Japanese, eucf),
                                   true);
        Am_Insert_String_At_Cursor(text, to_correct_code(onetotwo[c], eucf),
                                   advance_cursor);
      } else if (isshiin(c) &&
                 jcomp(&((const char *)old_str)[cursor_index], onetotwo[c]) ==
                     0) { // case 'tt' etc.
        Am_Move_Cursor_Left(text);
        Am_Insert_String_At_Cursor(text, to_correct_code(small_tsu, eucf),
                                   true);
        if (advance_cursor)
          Am_Move_Cursor_Right(text);
      } else { // not 'nn', 'tt' etc.
        int boin, shiin;
        switch (c) {
        case 'a':
          boin = 0;
          break;
        case 'i':
          boin = 1;
          break;
        case 'u':
          boin = 2;
          break;
        case 'e':
          boin = 3;
          break;
        case 'o':
          boin = 4;
          break;
        default: // case only Shiin
          Am_Insert_String_At_Cursor(text, to_correct_code(onetotwo[c], eucf),
                                     advance_cursor);
          return;
        }
        if (jcomp(&((const char *)old_str)[cursor_index], onetotwo['y']) == 0) {
          if (cursor_index >= head_pos + 2 &&
              (shiin = isalpha_2(&((const char *)old_str)[cursor_index - 2])) >
                  0) { //case 'kya' etc.
            Am_Delete_Char_Before_Cursor(text);
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[shiin][boin + 5], eucf),
                advance_cursor);
          } else { // two alphabets in 'y' case
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab['y' - 'a'][boin], eucf),
                advance_cursor);
          }
        } else if (jcomp(&((const char *)old_str)[cursor_index],
                         onetotwo['h']) == 0) { // case 'kha' etc.
          if (cursor_index >= head_pos + 2 &&
              (shiin = isalpha_2(&((const char *)old_str)[cursor_index - 2])) >
                  0) {
            Am_Delete_Char_Before_Cursor(text);
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[shiin][boin + 5], eucf),
                advance_cursor);
          } else { // two alphabets in 'h' case
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab['h' - 'a'][boin], eucf),
                advance_cursor);
          }
        } else { // without 'h', 'y'
          if ((shiin = isalpha_2(&((const char *)old_str)[cursor_index])) >
              0) { // case 'ka' etc.
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[shiin][boin], eucf),
                advance_cursor);
          } else { // case Boin only, such as 'a' etc.
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[0][boin], eucf), advance_cursor);
          }
        }
      }
    } else { // insert to the head of input field
      int boin;
      switch (c) {
      case 'a':
        boin = 0;
        break;
      case 'i':
        boin = 1;
        break;
      case 'u':
        boin = 2;
        break;
      case 'e':
        boin = 3;
        break;
      case 'o':
        boin = 4;
        break;
      default: // case only Shiin
        Am_Insert_String_At_Cursor(text, to_correct_code(onetotwo[c], eucf),
                                   advance_cursor);
        return;
      }
      Am_Insert_String_At_Cursor(text, to_correct_code(rktab[0][boin], eucf),
                                 advance_cursor);
    }
  }
}